

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.h
# Opt level: O2

void __thiscall SVGChart::LinTickIterator::~LinTickIterator(LinTickIterator *this)

{
  (this->super_TickIterator)._vptr_TickIterator = (_func_int **)&PTR__LinTickIterator_001119f8;
  std::__cxx11::string::~string((string *)&this->mFormatString);
  return;
}

Assistant:

LinTickIterator ():mCurrentTick (0), mDelta (0){}